

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O0

void binary_op_list(char *op,List *ls,int m68kop,ParsedOpcodeInfo *info,CCVariant *var)

{
  CCVariant *var_local;
  ParsedOpcodeInfo *info_local;
  ListStruct *pLStack_18;
  int m68kop_local;
  List *ls_local;
  char *op_local;
  
  putc(0x28,(FILE *)syn68k_c_stream);
  pLStack_18 = ls;
  if (ls == (List *)0x0) {
    fputs("0 ",(FILE *)syn68k_c_stream);
  }
  for (; pLStack_18 != (List *)0x0; pLStack_18 = pLStack_18->cdr) {
    generate_code_for_list(pLStack_18,m68kop,info,var);
    if (pLStack_18->cdr != (ListStruct *)0x0) {
      fprintf((FILE *)syn68k_c_stream,"%s ",op);
    }
  }
  putc(0x29,(FILE *)syn68k_c_stream);
  return;
}

Assistant:

static void
binary_op_list (const char *op, List *ls, int m68kop,
		const ParsedOpcodeInfo *info, const CCVariant *var)
{
  putc ('(', syn68k_c_stream);

  /* Output something for empty list. */
  if (ls == NULL)
    fputs ("0 ", syn68k_c_stream);
  for (; ls != NULL; ls = ls->cdr)
    {
      generate_code_for_list (ls, m68kop, info, var);
      if (ls->cdr != NULL)
	fprintf (syn68k_c_stream, "%s ", op);
    }
  putc (')', syn68k_c_stream);
}